

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlNodeSetPtr xmlXPathDistinctSorted(xmlNodeSetPtr nodes)

{
  int iVar1;
  xmlHashTablePtr hash_00;
  xmlChar *key;
  void *pvVar2;
  xmlNodePtr local_50;
  int local_44;
  xmlNodePtr cur;
  xmlChar *strval;
  int l;
  int i;
  xmlHashTablePtr hash;
  xmlNodeSetPtr ret;
  xmlNodeSetPtr nodes_local;
  
  nodes_local = nodes;
  if ((((nodes != (xmlNodeSetPtr)0x0) && (nodes->nodeNr != 0)) &&
      (nodes->nodeTab != (xmlNodePtr *)0x0)) &&
     (nodes_local = xmlXPathNodeSetCreate((xmlNodePtr)0x0), nodes_local != (xmlNodeSetPtr)0x0)) {
    if (nodes == (xmlNodeSetPtr)0x0) {
      local_44 = 0;
    }
    else {
      local_44 = nodes->nodeNr;
    }
    hash_00 = xmlHashCreate(local_44);
    for (strval._4_4_ = 0; strval._4_4_ < local_44; strval._4_4_ = strval._4_4_ + 1) {
      if (((nodes == (xmlNodeSetPtr)0x0) || (strval._4_4_ < 0)) || (nodes->nodeNr <= strval._4_4_))
      {
        local_50 = (xmlNodePtr)0x0;
      }
      else {
        local_50 = nodes->nodeTab[strval._4_4_];
      }
      key = xmlXPathCastNodeToString(local_50);
      pvVar2 = xmlHashLookup(hash_00,key);
      if (pvVar2 == (void *)0x0) {
        iVar1 = xmlHashAddEntry(hash_00,key,key);
        if (iVar1 < 0) {
          (*xmlFree)(key);
LAB_002203f9:
          xmlHashFree(hash_00,xmlHashDefaultDeallocator);
          xmlXPathFreeNodeSet(nodes_local);
          return (xmlNodeSetPtr)0x0;
        }
        iVar1 = xmlXPathNodeSetAddUnique(nodes_local,local_50);
        if (iVar1 < 0) goto LAB_002203f9;
      }
      else {
        (*xmlFree)(key);
      }
    }
    xmlHashFree(hash_00,xmlHashDefaultDeallocator);
  }
  return nodes_local;
}

Assistant:

xmlNodeSetPtr
xmlXPathDistinctSorted (xmlNodeSetPtr nodes) {
    xmlNodeSetPtr ret;
    xmlHashTablePtr hash;
    int i, l;
    xmlChar * strval;
    xmlNodePtr cur;

    if (xmlXPathNodeSetIsEmpty(nodes))
	return(nodes);

    ret = xmlXPathNodeSetCreate(NULL);
    if (ret == NULL)
        return(ret);
    l = xmlXPathNodeSetGetLength(nodes);
    hash = xmlHashCreate (l);
    for (i = 0; i < l; i++) {
	cur = xmlXPathNodeSetItem(nodes, i);
	strval = xmlXPathCastNodeToString(cur);
	if (xmlHashLookup(hash, strval) == NULL) {
	    if (xmlHashAddEntry(hash, strval, strval) < 0) {
                xmlFree(strval);
                goto error;
            }
	    if (xmlXPathNodeSetAddUnique(ret, cur) < 0)
	        goto error;
	} else {
	    xmlFree(strval);
	}
    }
    xmlHashFree(hash, xmlHashDefaultDeallocator);
    return(ret);

error:
    xmlHashFree(hash, xmlHashDefaultDeallocator);
    xmlXPathFreeNodeSet(ret);
    return(NULL);
}